

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int ColorIsPlausible(pyhanabi_card_knowledge_t *knowledge,int color)

{
  bool bVar1;
  undefined4 in_ESI;
  long *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x49,"int ColorIsPlausible(pyhanabi_card_knowledge_t *, int)");
  }
  if (*in_RDI != 0) {
    bVar1 = hanabi_learning_env::HanabiHand::CardKnowledge::ColorPlausible
                      ((CardKnowledge *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffec);
    return (int)bVar1;
  }
  __assert_fail("knowledge->knowledge != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x4a,"int ColorIsPlausible(pyhanabi_card_knowledge_t *, int)");
}

Assistant:

int ColorIsPlausible(pyhanabi_card_knowledge_t* knowledge, int color) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->ColorPlausible(color);
}